

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_table.hpp
# Opt level: O1

int __thiscall andyzip::huffman_table<258>::init(huffman_table<258> *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX EVar1;
  byte bVar2;
  uint in_ECX;
  ulong uVar3;
  ushort *in_RDX;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  EVP_PKEY_CTX EVar7;
  EVP_PKEY_CTX EVar8;
  int iVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  
  this->invalid_ = true;
  if (in_ECX == 2) {
    this->min_length_ = '\x01';
    this->max_length_ = '\x01';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    this->symbols_[0] = *in_RDX;
    in_ECX = (uint)in_RDX[1];
    this->symbols_[1] = in_RDX[1];
  }
  else if (in_ECX == 1) {
    this->min_length_ = '\0';
    this->max_length_ = '\0';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    in_ECX = (uint)*in_RDX;
    this->symbols_[0] = *in_RDX;
  }
  else {
    this->min_length_ = '\x10';
    this->max_length_ = '\0';
    if (in_ECX != 0) {
      EVar7 = (EVP_PKEY_CTX)0x10;
      uVar6 = 0;
      EVar8 = (EVP_PKEY_CTX)0x0;
      do {
        EVar1 = ctx[uVar6];
        if (EVar1 != (EVP_PKEY_CTX)0x0) {
          if ((byte)EVar1 < (byte)EVar7) {
            this->min_length_ = (uint8_t)EVar1;
            EVar7 = EVar1;
          }
          EVar1 = ctx[uVar6];
          if ((byte)EVar8 < (byte)EVar1) {
            this->max_length_ = (uint8_t)EVar1;
            EVar8 = EVar1;
          }
        }
        uVar6 = uVar6 + 1;
      } while (in_ECX != uVar6);
    }
    uVar6 = (ulong)this->min_length_;
    if (uVar6 == 0) {
      return in_ECX;
    }
    bVar2 = this->max_length_;
    if (0x10 < bVar2 || bVar2 < this->min_length_) {
      return in_ECX;
    }
    iVar9 = 0;
    uVar5 = 0;
    uVar4 = uVar6;
    do {
      *(short *)((long)this + (uVar4 - uVar6) * 2 + 0x22a) = (short)iVar9 - (short)uVar5;
      if (in_ECX != 0) {
        uVar3 = 0;
        do {
          if (uVar4 == (byte)ctx[uVar3]) {
            if (in_RDX == (ushort *)0x0) {
              uVar11 = (ushort)uVar3;
            }
            else {
              uVar11 = in_RDX[uVar3];
            }
            uVar10 = (ulong)uVar5;
            uVar5 = uVar5 + 1;
            this->symbols_[uVar10] = uVar11;
            iVar9 = iVar9 + 1;
          }
          uVar3 = uVar3 + 1;
        } while (in_ECX != uVar3);
      }
      uVar12 = (iVar9 << (0x10U - (char)uVar4 & 0x1f)) - 1;
      *(short *)((long)this + (uVar4 - uVar6) * 2 + 0x206) = (short)uVar12;
      if (0xffff < uVar12) {
        return in_ECX;
      }
      iVar9 = iVar9 * 2;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (ulong)bVar2 + 1);
    *(undefined2 *)((long)this + (((ulong)bVar2 + 1) - uVar6) * 2 + 0x206) = 0xffff;
  }
  this->invalid_ = false;
  return in_ECX;
}

Assistant:

void init(const uint8_t *lengths, const uint16_t *symbols, unsigned num_lengths) {
      invalid_ = true;

      if (num_lengths == 1) {
        min_length_ = 0;
        max_length_ = 0;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        invalid_ = false;
        return;
      }
      if (num_lengths == 2) {
        min_length_ = 1;
        max_length_ = 1;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        symbols_[1] = symbols[1];
        invalid_ = false;
        return;
      }

      min_length_ = 16;
      max_length_ = 0;
      for (unsigned i = 0; i != num_lengths; ++i) {
        if (lengths[i]) {
          if (min_length_ > lengths[i]) min_length_ = lengths[i];
          if (max_length_ < lengths[i]) max_length_ = lengths[i];
        }
      }

      if ( min_length_ <= 0 || min_length_ > max_length_ || max_length_ > 16 ) {
        return;
      }

      unsigned code = 0;
      unsigned huffcode = 0;
      for (unsigned length = min_length_; length <= max_length_; ++length) {
        base_[length-min_length_] = huffcode - code;
        for (unsigned i = 0; i != num_lengths; ++i) {
          if (lengths[i] == length) {
            symbols_[code++] = symbols ? symbols[i] : i;
            huffcode++;
          }
        }
        limits_[length-min_length_] = (uint16_t)( ( huffcode << (16-length) ) - 1 );
        if (( huffcode << (16-length) ) - 1 > 0xffff) {
          return;
        }
        huffcode *= 2;
      }

      // prevent escape from bitstream decoding loop.
      limits_[max_length_+1-min_length_] = 0xffff;
      invalid_ = false;
    }